

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::GetSingleFileBuildCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string generator;
  string make;
  ostringstream ss;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  allocator local_1c8 [32];
  string local_1a8 [32];
  ostream local_188;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_188,"CMAKE_MAKE_PROGRAM",(allocator *)&local_1e8);
  pcVar2 = cmMakefile::GetRequiredDefinition(mf,(string *)&local_188);
  std::__cxx11::string::string(local_1a8,pcVar2,local_1c8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_188,"CMAKE_GENERATOR",local_1c8);
  pcVar2 = cmMakefile::GetSafeDefinition(mf,(string *)&local_188);
  std::__cxx11::string::string((string *)&local_1e8,pcVar2,&local_1e9);
  std::__cxx11::string::~string((string *)&local_188);
  bVar1 = std::operator==(&local_1e8,"Unix Makefiles");
  if (!bVar1) {
    bVar1 = std::operator==(&local_1e8,"MinGW Makefiles");
    if (!bVar1) goto LAB_00397e8b;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  poVar3 = std::operator<<(&local_188,local_1a8);
  std::operator<<(poVar3," -f$(ProjectPath)/Makefile $(CurrentFileName).cpp.o");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1c8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
LAB_00397e8b:
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraCodeLiteGenerator::GetSingleFileBuildCommand
(const cmMakefile* mf) const
{
  std::string buildCommand;
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  if ( generator == "Unix Makefiles" || generator == "MinGW Makefiles" )
    {
    std::ostringstream ss;
    ss << make << " -f$(ProjectPath)/Makefile $(CurrentFileName).cpp.o";
    buildCommand = ss.str();
    }
  return buildCommand;
}